

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void test_xor_inplace(_Bool copy_on_write)

{
  roaring_bitmap_t *r2;
  long lVar1;
  _Bool _Var2;
  roaring_bitmap_t *prVar3;
  roaring_bitmap_t *prVar4;
  uint64_t uVar5;
  roaring_bitmap_t *r1;
  roaring_bitmap_t *x1;
  uint64_t uVar6;
  uint val;
  roaring_bitmap_t **pprVar7;
  ulong uVar8;
  ulong uVar9;
  int i;
  roaring_bitmap_t *r [10];
  
  prVar3 = roaring_bitmap_create();
  (prVar3->high_low_container).flags = (prVar3->high_low_container).flags & 0xfe | copy_on_write;
  prVar4 = roaring_bitmap_create();
  (prVar4->high_low_container).flags = (prVar4->high_low_container).flags & 0xfe | copy_on_write;
  for (val = 0; val != 300; val = val + 1) {
    if ((val & 1) == 0) {
      roaring_bitmap_add(prVar3,val);
    }
    if ((short)((short)((val & 0xffff) / 3) * -3 + (short)val) == 0) {
      roaring_bitmap_add(prVar4,val);
    }
  }
  roaring_bitmap_xor_inplace(prVar3,prVar4);
  uVar5 = roaring_bitmap_get_cardinality(prVar3);
  _assert_int_equal(uVar5,0x96,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x7ce);
  roaring_bitmap_free(prVar4);
  roaring_bitmap_free(prVar3);
  prVar4 = gen_bitmap(0.0,1e-06,1,0,0,1000000);
  r[0] = prVar4;
  r[1] = gen_bitmap(1.0,-1e-06,1,0,0,1000000);
  r[2] = gen_bitmap(1e-05,0.0,1,0,0,2000000);
  r[3] = gen_bitmap(1e-05,0.0,3,0,0,2000000);
  r[4] = gen_bitmap(0.1,0.0,1,0,0,2000000);
  r[5] = gen_bitmap(0.001,1e-07,1,0,0,1000000);
  r[6] = gen_bitmap(0.0,1e-10,1,0,0,1000000);
  r[7] = gen_bitmap(0.5,-1e-06,1,600000,800000,1000000);
  r[8] = gen_bitmap(1.0,-1e-06,1,300000,500000,1000000);
  r[9] = (roaring_bitmap_t *)0x0;
  uVar9 = 1;
  _i = 0;
  prVar3 = prVar4;
  while (uVar8 = uVar9, prVar3 != (roaring_bitmap_t *)0x0) {
    for (; r2 = r[uVar8], r2 != (roaring_bitmap_t *)0x0; uVar8 = uVar8 + 1) {
      r1 = synthesized_xor(prVar3,r2);
      x1 = roaring_bitmap_copy(prVar3);
      (x1->high_low_container).flags = ((x1->high_low_container).flags & 0xfe) + copy_on_write;
      roaring_bitmap_xor_inplace(x1,r2);
      _Var2 = roaring_bitmap_equals(r1,x1);
      if (!_Var2) {
        printf("problem with i=%d j=%d\n",_i,uVar8 & 0xffffffff);
        uVar5 = roaring_bitmap_get_cardinality(x1);
        uVar6 = roaring_bitmap_get_cardinality(r1);
        printf("copy\'s cardinality  is %d and expected\'s is %d\n",uVar5 & 0xffffffff,
               uVar6 & 0xffffffff);
        show_difference(x1,r1);
      }
      _assert_true((ulong)_Var2,"is_equal",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                   ,0x7fc);
      roaring_bitmap_free(r1);
      roaring_bitmap_free(x1);
    }
    uVar9 = uVar9 + 1;
    lVar1 = _i + 1;
    _i = _i + 1;
    prVar3 = r[lVar1];
  }
  pprVar7 = r;
  while (pprVar7 = pprVar7 + 1, prVar4 != (roaring_bitmap_t *)0x0) {
    roaring_bitmap_free(prVar4);
    prVar4 = *pprVar7;
  }
  return;
}

Assistant:

void test_xor_inplace(bool copy_on_write) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r2, copy_on_write);

    for (uint32_t i = 0; i < 300; ++i) {
        if (i % 2 == 0) roaring_bitmap_add(r1, i);
        if (i % 3 == 0) roaring_bitmap_add(r2, i);
    }
    roaring_bitmap_xor_inplace(r1, r2);
    assert_int_equal(roaring_bitmap_get_cardinality(r1), 166 - 16);

    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);

    // some tougher tests on synthetic data

    roaring_bitmap_t *r[] = {
        // ascending density, last containers might be runs
        gen_bitmap(0.0, 1e-6, 1, 0, 0, 1000000),
        // descending density, first containers might be runs
        gen_bitmap(1.0, -1e-6, 1, 0, 0, 1000000),
        // uniformly rather sparse
        gen_bitmap(1e-5, 0.0, 1, 0, 0, 2000000),
        // uniformly rather sparse with runs
        gen_bitmap(1e-5, 0.0, 3, 0, 0, 2000000),
        // uniformly rather dense
        gen_bitmap(1e-1, 0.0, 1, 0, 0, 2000000),
        // ascending density but never too dense
        gen_bitmap(0.001, 1e-7, 1, 0, 0, 1000000),
        // ascending density but very sparse
        gen_bitmap(0.0, 1e-10, 1, 0, 0, 1000000),
        // descending with a gap
        gen_bitmap(0.5, -1e-6, 1, 600000, 800000, 1000000),
        //  gap elsewhere
        gen_bitmap(1, -1e-6, 1, 300000, 500000, 1000000),
        0  // sentinel
    };

    for (int i = 0; r[i]; ++i) {
        for (int j = i + 1; r[j]; ++j) {
            roaring_bitmap_t *expected = synthesized_xor(r[i], r[j]);
            roaring_bitmap_t *copy = roaring_bitmap_copy(r[i]);
            roaring_bitmap_set_copy_on_write(copy, copy_on_write);

            roaring_bitmap_xor_inplace(copy, r[j]);

            bool is_equal = roaring_bitmap_equals(expected, copy);
            if (!is_equal) {
                printf("problem with i=%d j=%d\n", i, j);
                printf("copy's cardinality  is %d and expected's is %d\n",
                       (int)roaring_bitmap_get_cardinality(copy),
                       (int)roaring_bitmap_get_cardinality(expected));
                show_difference(copy, expected);
            }

            assert_true(is_equal);
            roaring_bitmap_free(expected);
            roaring_bitmap_free(copy);
        }
    }
    for (int i = 0; r[i]; ++i) roaring_bitmap_free(r[i]);
}